

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O3

void gen_ofs_string(char *buf,size_t buflen,char *prefix,int32_t ofs,int flags)

{
  char *fmt;
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  uVar3 = (ulong)(uint)-ofs;
  if (0 < ofs) {
    uVar3 = (ulong)(uint)ofs;
  }
  iVar4 = (int)(uVar3 / 0x3c);
  uVar5 = iVar4 + (int)(uVar3 / 0xe10) * -0x3c;
  uVar6 = (uint)uVar3 + iVar4 * -0x3c;
  if (uVar6 == 0) {
    if (uVar5 == 0) {
      fmt = "%s";
      if ((flags & 1U) == 0) {
        fmt = "%s%s%d";
      }
      if (0xe0f < (uint)uVar3) {
        fmt = "%s%s%d";
      }
    }
    else {
      fmt = "%s%s%d:%02d";
    }
  }
  else {
    fmt = "%s%s%d:%02d:%02d";
  }
  pcVar1 = "+";
  if ((flags & 2U) == 0) {
    pcVar1 = "";
  }
  pcVar2 = "-";
  if (-1 < ofs) {
    pcVar2 = pcVar1;
  }
  t3sprintf(buf,buflen,fmt,prefix,pcVar2,uVar3 / 0xe10,(ulong)uVar5,(ulong)uVar6);
  return;
}

Assistant:

static void gen_ofs_string(char *buf, size_t buflen,
                           const char *prefix, int32_t ofs, int flags)
{
    /* figure the sign */
    const char *signch = "";
    if (ofs < 0)
        ofs = -ofs, signch = "-";
    else if ((flags & F_PLUS_SIGN) != 0)
        signch = "+";

    /* decompose the offset into hours, minutes, and seconds */
    int hh = ofs / (60*60);
    int mm = ofs/60 % 60;
    int ss = ofs % 60;

    /* 
     *   figure the format: prefix, sign character, then h:mm:ss if we have
     *   non-zero seconds, h:mm if we have non-zero minutes but no seconds,
     *   or just the hours if the minutes and seconds are both zero 
     */ 
    const char *fmt = (ss != 0 ? "%s%s%d:%02d:%02d" :
                       mm != 0 ? "%s%s%d:%02d" :
                       hh != 0 || (flags & F_HIDE_ZERO) == 0 ? "%s%s%d" :
                       "%s");

    /* generate the string */
    t3sprintf(buf, buflen, fmt, prefix, signch, hh, mm, ss);
}